

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CATNLoader.hpp
# Opt level: O2

Grammar<unsigned_char> *
LoadGrammar<unsigned_char>(Grammar<unsigned_char> *__return_storage_ptr__,char *filename)

{
  Centaurus::Grammar<unsigned_char>::Grammar(__return_storage_ptr__);
  Centaurus::Grammar<unsigned_char>::parse(__return_storage_ptr__,"../../grammar/json2.cgr",1);
  return __return_storage_ptr__;
}

Assistant:

static Centaurus::Grammar<TCHAR> LoadGrammar(const char *filename)
{
    using namespace Microsoft::VisualStudio::CppUnitTestFramework;

    Centaurus::Grammar<TCHAR> grammar;

    try
    {
        grammar.parse(filename);
    }
    catch (const std::exception& ex)
    {
        Assert::Fail(L"ATN construction failed.");
    }

    return grammar;
}